

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O2

RC __thiscall QL_NodeRel::SetUpNode(QL_NodeRel *this,int *attrs,int attrlistSize)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_QL_Node).attrsInRecSize = attrlistSize;
  piVar1 = (int *)malloc((long)attrlistSize * 4);
  (this->super_QL_Node).attrsInRec = piVar1;
  piVar1[0] = 0;
  piVar1[1] = 0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)attrlistSize;
  if (attrlistSize < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = attrs[uVar2];
  }
  (this->super_QL_Node).listsInitialized = true;
  return 0;
}

Assistant:

RC QL_NodeRel::SetUpNode(int *attrs, int attrlistSize){
  RC rc = 0;
  attrsInRecSize = attrlistSize;
  attrsInRec = (int*)malloc(attrlistSize*sizeof(int));
  memset((void *)attrsInRec, 0, sizeof(attrsInRec));
  for(int i = 0; i < attrlistSize; i++){
    attrsInRec[i] = attrs[i];
  }
  listsInitialized = true;

  return (rc);
}